

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

void av1_txb_init_levels_c(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t uVar4;
  int iVar5;
  
  memset(levels + (height + 4) * width,0,(long)(height * 4 + 0x20));
  if (0 < width) {
    uVar2 = 0;
    do {
      if (0 < height) {
        uVar3 = 0;
        do {
          iVar1 = coeff[uVar3];
          iVar5 = -iVar1;
          if (0 < iVar1) {
            iVar5 = iVar1;
          }
          uVar4 = (uint8_t)iVar5;
          if (0x7e < iVar5) {
            uVar4 = '\x7f';
          }
          levels[uVar3] = uVar4;
          uVar3 = uVar3 + 1;
        } while ((uint)height != uVar3);
        levels = levels + uVar3;
      }
      levels[0] = '\0';
      levels[1] = '\0';
      levels[2] = '\0';
      levels[3] = '\0';
      levels = levels + 4;
      uVar2 = uVar2 + 1;
      coeff = coeff + (uint)height;
    } while (uVar2 != (uint)width);
  }
  return;
}

Assistant:

void av1_txb_init_levels_c(const tran_low_t *const coeff, const int width,
                           const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  uint8_t *ls = levels;

  memset(levels + stride * width, 0,
         sizeof(*levels) * (TX_PAD_BOTTOM * stride + TX_PAD_END));

  for (int i = 0; i < width; i++) {
    for (int j = 0; j < height; j++) {
      *ls++ = (uint8_t)clamp(abs(coeff[i * height + j]), 0, INT8_MAX);
    }
    for (int j = 0; j < TX_PAD_HOR; j++) {
      *ls++ = 0;
    }
  }
}